

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subprocess-posix.cc
# Opt level: O3

Subprocess * __thiscall SubprocessSet::Add(SubprocessSet *this,string *command,bool use_console)

{
  pointer *pppSVar1;
  iterator __position;
  Subprocess *this_00;
  Subprocess *subprocess;
  Subprocess *local_28;
  
  this_00 = (Subprocess *)operator_new(0x30);
  (this_00->buf_)._M_dataplus._M_p = (pointer)&(this_00->buf_).field_2;
  (this_00->buf_)._M_string_length = 0;
  (this_00->buf_).field_2._M_local_buf[0] = '\0';
  this_00->fd_ = -1;
  this_00->pid_ = -1;
  this_00->use_console_ = use_console;
  local_28 = this_00;
  Subprocess::Start(this_00,this,command);
  __position._M_current =
       (this->running_).super__Vector_base<Subprocess_*,_std::allocator<Subprocess_*>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->running_).super__Vector_base<Subprocess_*,_std::allocator<Subprocess_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<Subprocess*,std::allocator<Subprocess*>>::_M_realloc_insert<Subprocess*const&>
              ((vector<Subprocess*,std::allocator<Subprocess*>> *)this,__position,&local_28);
  }
  else {
    *__position._M_current = this_00;
    pppSVar1 = &(this->running_).super__Vector_base<Subprocess_*,_std::allocator<Subprocess_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
    *pppSVar1 = *pppSVar1 + 1;
    local_28 = this_00;
  }
  return local_28;
}

Assistant:

Subprocess *SubprocessSet::Add(const string& command, bool use_console) {
  Subprocess *subprocess = new Subprocess(use_console);
  if (!subprocess->Start(this, command)) {
    delete subprocess;
    return 0;
  }
  running_.push_back(subprocess);
  return subprocess;
}